

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseExprList(WastParser *this,ExprList *exprs)

{
  bool bVar1;
  Result RVar2;
  __off64_t *in_R8;
  size_t in_R9;
  iterator iVar3;
  intrusive_list<wabt::Expr> *this_00;
  Expr *local_48;
  undefined1 local_38 [8];
  ExprList new_exprs;
  ExprList *exprs_local;
  WastParser *this_local;
  
  new_exprs.size_ = (size_t)exprs;
  intrusive_list<wabt::Expr>::intrusive_list((intrusive_list<wabt::Expr> *)local_38);
  do {
    while( true ) {
      bVar1 = PeekMatchExpr(this);
      if (!bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Ok);
        goto LAB_001af168;
      }
      RVar2 = ParseExpr(this,(ExprList *)local_38);
      bVar1 = Succeeded(RVar2);
      if (!bVar1) break;
      this_00 = (intrusive_list<wabt::Expr> *)new_exprs.size_;
      iVar3 = intrusive_list<wabt::Expr>::end((intrusive_list<wabt::Expr> *)new_exprs.size_);
      local_48 = iVar3.node_;
      intrusive_list<wabt::Expr>::splice
                (this_00,(int)iVar3.list_,(__off64_t *)local_48,(int)local_38,in_R8,in_R9,
                 (uint)this_00);
    }
    RVar2 = Synchronize(this,anon_unknown_1::IsExpr);
    bVar1 = Failed(RVar2);
  } while (!bVar1);
  Result::Result((Result *)((long)&this_local + 4),Error);
LAB_001af168:
  intrusive_list<wabt::Expr>::~intrusive_list((intrusive_list<wabt::Expr> *)local_38);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseExprList(ExprList* exprs) {
  WABT_TRACE(ParseExprList);
  ExprList new_exprs;
  while (PeekMatchExpr()) {
    if (Succeeded(ParseExpr(&new_exprs))) {
      exprs->splice(exprs->end(), new_exprs);
    } else {
      CHECK_RESULT(Synchronize(IsExpr));
    }
  }
  return Result::Ok;
}